

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O2

bool vkt::pipeline::isVertexFormatUnorm(VkFormat format)

{
  if (((0x3f < format - VK_FORMAT_R4G4_UNORM_PACK8) ||
      ((0x8200081020408129U >> ((ulong)(format - VK_FORMAT_R4G4_UNORM_PACK8) & 0x3f) & 1) == 0)) &&
     ((0x15 < format - VK_FORMAT_R16_UNORM ||
      ((0x204081U >> (format - VK_FORMAT_R16_UNORM & 0x1f) & 1) == 0)))) {
    return false;
  }
  return true;
}

Assistant:

bool isVertexFormatUnorm (VkFormat format)
{
	switch (format)
	{
		case VK_FORMAT_R8_UNORM:
		case VK_FORMAT_R4G4_UNORM_PACK8:
		case VK_FORMAT_R8G8_UNORM:
		case VK_FORMAT_R16_UNORM:
		case VK_FORMAT_R5G6B5_UNORM_PACK16:
		case VK_FORMAT_R5G5B5A1_UNORM_PACK16:
		case VK_FORMAT_R8G8B8_UNORM:
		case VK_FORMAT_B8G8R8_UNORM:
		case VK_FORMAT_R8G8B8A8_UNORM:
		case VK_FORMAT_A2R10G10B10_UNORM_PACK32:
		case VK_FORMAT_R16G16_UNORM:
		case VK_FORMAT_B8G8R8A8_UNORM:
		case VK_FORMAT_A2B10G10R10_UNORM_PACK32:
		case VK_FORMAT_R16G16B16_UNORM:
		case VK_FORMAT_R16G16B16A16_UNORM:
			return true;

		default:
			break;
	}

	return false;

}